

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O2

void test_enable_reuse_address(void)

{
  cio_error cVar1;
  cio_server_socket ss;
  cio_eventloop loop;
  
  setsockopt_fake.custom_fake = setsockopt_capture;
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  cVar1 = cio_server_socket_init
                    (&ss,&loop,5,CIO_ADDRESS_FAMILY_INET4,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Initialization of server socket failed!",0x275,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_set_reuse_address(&ss,true);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x278,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)optval,(char *)0x0,0x279,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)setsockopt_fake.arg1_val,(char *)0x0,0x27a,UNITY_DISPLAY_STYLE_INT)
  ;
  UnityAssertEqualNumber(2,(long)setsockopt_fake.arg2_val,(char *)0x0,0x27b,UNITY_DISPLAY_STYLE_INT)
  ;
  UnityAssertEqualNumber
            (4,(ulong)setsockopt_fake.arg4_val,(char *)0x0,0x27c,UNITY_DISPLAY_STYLE_INT);
  cio_server_socket_close(&ss);
  return;
}

Assistant:

static void test_enable_reuse_address(void)
{
	setsockopt_fake.custom_fake = setsockopt_capture;

	struct cio_eventloop loop;
	struct cio_server_socket ss;

	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, CIO_ADDRESS_FAMILY_INET4, alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Initialization of server socket failed!");

	err = cio_server_socket_set_reuse_address(&ss, true);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, optval);
	TEST_ASSERT_EQUAL(SOL_SOCKET, setsockopt_fake.arg1_val);
	TEST_ASSERT_EQUAL(SO_REUSEADDR, setsockopt_fake.arg2_val);
	TEST_ASSERT_EQUAL(sizeof(int), setsockopt_fake.arg4_val);
	cio_server_socket_close(&ss);
}